

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O2

void __thiscall ED::ComputeGradient(ED *this)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  short *psVar10;
  int iVar11;
  short sVar12;
  int iVar13;
  short *psVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int j;
  int iVar18;
  uint uVar19;
  int unaff_R14D;
  
  uVar3 = this->width;
  iVar18 = this->height;
  lVar7 = (long)(int)uVar3;
  sVar12 = (short)this->gradThresh + -1;
  psVar14 = this->gradImg;
  uVar15 = 0;
  uVar16 = 0;
  if (0 < (int)uVar3) {
    uVar16 = (ulong)uVar3;
  }
  psVar10 = psVar14 + (int)((iVar18 + -1) * uVar3);
  for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
    psVar10[uVar15] = sVar12;
    psVar14[uVar15] = sVar12;
  }
  sVar12 = (short)this->gradThresh + -1;
  psVar14 = this->gradImg;
  for (lVar17 = 1; lVar17 < iVar18 + -1; lVar17 = lVar17 + 1) {
    psVar14[lVar7 * 2 + -1] = sVar12;
    psVar14[lVar7] = sVar12;
    psVar14 = psVar14 + lVar7;
  }
  iVar8 = 2;
  iVar13 = 0;
  iVar5 = 1;
  do {
    if (iVar18 + -1 <= iVar5) {
      return;
    }
    for (iVar18 = 1; iVar18 < (int)(uVar3 - 1); iVar18 = iVar18 + 1) {
      if (3 < this->op - PREWITT_OPERATOR) goto LAB_00104d3a;
      puVar1 = this->smoothImg;
      lVar17 = (long)(int)(iVar8 * uVar3 + iVar18);
      lVar7 = (long)(int)(iVar13 * uVar3 + iVar18);
      iVar6 = (uint)puVar1[lVar17 + 1] - (uint)puVar1[lVar7 + -1];
      iVar11 = (uint)puVar1[lVar7 + 1] - (uint)puVar1[lVar17 + -1];
      switch(this->op) {
      case PREWITT_OPERATOR:
        lVar9 = (long)(int)(iVar5 * uVar3 + iVar18);
        uVar19 = ((uint)puVar1[lVar9 + 1] + iVar11 + iVar6) - (uint)puVar1[lVar9 + -1];
        uVar2 = -uVar19;
        if (0 < (int)uVar19) {
          uVar2 = uVar19;
        }
        iVar6 = ((uint)puVar1[lVar17] + iVar6) - ((uint)puVar1[lVar7] + iVar11);
        goto LAB_00104ca4;
      case SOBEL_OPERATOR:
        lVar9 = (long)(int)(iVar5 * uVar3 + iVar18);
        uVar19 = iVar6 + iVar11 + ((uint)puVar1[lVar9 + 1] - (uint)puVar1[lVar9 + -1]) * 2;
        uVar2 = -uVar19;
        if (0 < (int)uVar19) {
          uVar2 = uVar19;
        }
        psVar10 = (short *)(ulong)uVar2;
        iVar6 = (iVar6 - iVar11) + ((uint)puVar1[lVar17] - (uint)puVar1[lVar7]) * 2;
        unaff_R14D = -iVar6;
        if (0 < iVar6) {
          unaff_R14D = iVar6;
        }
        break;
      case SCHARR_OPERATOR:
        lVar9 = (long)(int)(iVar5 * uVar3 + iVar18);
        uVar19 = ((uint)puVar1[lVar9 + 1] - (uint)puVar1[lVar9 + -1]) * 10 + (iVar6 + iVar11) * 3;
        uVar2 = -uVar19;
        if (0 < (int)uVar19) {
          uVar2 = uVar19;
        }
        iVar6 = ((uint)puVar1[lVar17] - (uint)puVar1[lVar7]) * 10 + (iVar6 - iVar11) * 3;
LAB_00104ca4:
        psVar10 = (short *)(ulong)uVar2;
        unaff_R14D = -iVar6;
        if (0 < iVar6) {
          unaff_R14D = iVar6;
        }
        break;
      case LSD_OPERATOR:
        lVar7 = (long)(int)(iVar5 * uVar3 + iVar18);
        iVar6 = (uint)puVar1[lVar17 + 1] - (uint)puVar1[lVar7];
        uVar2 = ((uint)puVar1[lVar7 + 1] - (uint)puVar1[lVar17]) + iVar6;
        uVar19 = -uVar2;
        if (0 < (int)uVar2) {
          uVar19 = uVar2;
        }
        psVar10 = (short *)(ulong)uVar19;
        iVar6 = iVar6 - ((uint)puVar1[lVar7 + 1] - (uint)puVar1[lVar17]);
        unaff_R14D = -iVar6;
        if (0 < iVar6) {
          unaff_R14D = iVar6;
        }
      }
LAB_00104d3a:
      iVar6 = (int)psVar10;
      if (this->sumFlag == true) {
        iVar11 = unaff_R14D + iVar6;
      }
      else {
        iVar11 = (int)SQRT((double)iVar6 * (double)iVar6 + (double)(unaff_R14D * unaff_R14D));
      }
      iVar4 = uVar3 * iVar5 + iVar18;
      this->gradImg[iVar4] = (short)iVar11;
      if (this->gradThresh <= iVar11) {
        this->dirImg[iVar4] = (iVar6 < unaff_R14D) + '\x01';
      }
      uVar3 = this->width;
    }
    iVar18 = this->height;
    iVar8 = iVar8 + 1;
    iVar13 = iVar13 + 1;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void ED::ComputeGradient()
{	
	// Initialize gradient image for row = 0, row = height-1, column=0, column=width-1 
	for (int j = 0; j<width; j++) { gradImg[j] = gradImg[(height - 1)*width + j] = gradThresh - 1; }
	for (int i = 1; i<height - 1; i++) { gradImg[i*width] = gradImg[(i + 1)*width - 1] = gradThresh - 1; }

	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			// Prewitt Operator in horizontal and vertical direction
			// A B C
			// D x E
			// F G H
			// gx = (C-A) + (E-D) + (H-F)
			// gy = (F-A) + (G-B) + (H-C)
			//
			// To make this faster: 
			// com1 = (H-A)
			// com2 = (C-F)
			// 
			// For Prewitt
			// Then: gx = com1 + com2 + (E-D) = (H-A) + (C-F) + (E-D) = (C-A) + (E-D) + (H-F)
			//       gy = com1 - com2 + (G-B) = (H-A) - (C-F) + (G-B) = (F-A) + (G-B) + (H-C)
			// 
			// For Sobel
			// Then: gx = com1 + com2 + 2*(E-D) = (H-A) + (C-F) + 2*(E-D) = (C-A) + 2*(E-D) + (H-F)
			//       gy = com1 - com2 + 2*(G-B) = (H-A) - (C-F) + 2*(G-B) = (F-A) + 2*(G-B) + (H-C)
			//
			// For Scharr
			// Then: gx = 3*(com1 + com2) + 10*(E-D) = 3*(H-A) + 3*(C-F) + 10*(E-D) = 3*(C-A) + 10*(E-D) + 3*(H-F)
			//       gy = 3*(com1 - com2) + 10*(G-B) = 3*(H-A) - 3*(C-F) + 10*(G-B) = 3*(F-A) + 10*(G-B) + 3*(H-C)
			//
			// For LSD
			// A B
			// C D
			// gx = (B-A) + (D-C)
			// gy = (C-A) + (D-B)
			//
			// To make this faster: 
			// com1 = (D-A)
			// com2 = (B-C)
			// Then: gx = com1 + com2 = (D-A) + (B-C) = (B-A) + (D-C)
			//       gy = com1 - com2 = (D-A) - (B-C) = (C-A) + (D-B)

			int com1 = smoothImg[(i + 1)*width + j + 1] - smoothImg[(i - 1)*width + j - 1];
			int com2 = smoothImg[(i - 1)*width + j + 1] - smoothImg[(i + 1)*width + j - 1];

			int gx;
			int gy;
			
			switch (op)
			{
			case PREWITT_OPERATOR:
				gx = abs(com1 + com2 + (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
				gy = abs(com1 - com2 + (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));
				break;
			case SOBEL_OPERATOR:
				gx = abs(com1 + com2 + 2 * (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
				gy = abs(com1 - com2 + 2 * (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));
				break;
			case SCHARR_OPERATOR:
				gx = abs(3 * (com1 + com2) + 10 * (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
				gy = abs(3 * (com1 - com2) + 10 * (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));
				break;
			case LSD_OPERATOR:
				// com1 and com2 differs from previous operators, because LSD has 2x2 kernel
				int com1 = smoothImg[(i + 1)*width + j + 1] - smoothImg[i*width + j];
				int com2 = smoothImg[i*width + j + 1] - smoothImg[(i + 1)*width + j];

				gx = abs(com1 + com2);
				gy = abs(com1 - com2);
			}
			
			int sum;

			if(sumFlag)
				sum = gx + gy;
			else
				sum = (int)sqrt((double)gx*gx + gy*gy);

			int index = i*width + j;
			gradImg[index] = sum;

			if (sum >= gradThresh) {
				if (gx >= gy) dirImg[index] = EDGE_VERTICAL;
				else          dirImg[index] = EDGE_HORIZONTAL;
			} //end-if
		} // end-for
	} // end-for
}